

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_memory.cpp
# Opt level: O3

void duckdb::DuckDBMemoryFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  reference pvVar2;
  char *pcVar3;
  ulong index;
  _func_int **__n;
  idx_t iVar4;
  bool bVar5;
  allocator local_99;
  vector<duckdb::MemoryInformation,_true> *local_98;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)pGVar1[2]._vptr_GlobalTableFunctionState -
              (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3) * -0x5555555555555555)) {
    local_98 = (vector<duckdb::MemoryInformation,_true> *)(pGVar1 + 1);
    index = 0;
    do {
      pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar2 = vector<duckdb::MemoryInformation,_true>::operator[](local_98,(size_type)__n);
      pcVar3 = EnumUtil::ToChars<duckdb::MemoryTag>(pvVar2->tag);
      ::std::__cxx11::string::string((string *)&local_90,pcVar3,&local_99);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      iVar4 = pvVar2->size;
      if ((long)iVar4 < 1) {
        iVar4 = 0;
      }
      Value::BIGINT(&local_70,iVar4);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      iVar4 = pvVar2->evicted_data;
      if ((long)iVar4 < 1) {
        iVar4 = 0;
      }
      Value::BIGINT(&local_70,iVar4);
      DataChunk::SetValue(output,2,index,&local_70);
      Value::~Value(&local_70);
      iVar4 = index + 1;
      __n = pGVar1[4]._vptr_GlobalTableFunctionState;
    } while ((__n < (_func_int **)
                    (((long)pGVar1[2]._vptr_GlobalTableFunctionState -
                      (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3) * -0x5555555555555555))
            && (bVar5 = index < 0x7ff, index = iVar4, bVar5));
    output->count = iVar4;
  }
  return;
}

Assistant:

void DuckDBMemoryFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBMemoryData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];
		// return values:
		idx_t col = 0;
		// tag, VARCHAR
		output.SetValue(col++, count, EnumUtil::ToString(entry.tag));
		// memory_usage_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(ClampReportedMemory(entry.size)));
		// temporary_storage_bytes, BIGINT
		output.SetValue(col++, count, Value::BIGINT(ClampReportedMemory(entry.evicted_data)));
		count++;
	}
	output.SetCardinality(count);
}